

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * f32_range(int n,float start,float end)

{
  allocator_type *__a;
  reference pvVar1;
  int in_ESI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float fVar3;
  int i;
  float step;
  vector<float,_std::allocator<float>_> *values;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  undefined1 local_16;
  undefined1 local_15;
  float local_14;
  float local_10;
  int local_c;
  
  local_15 = 0;
  __a = (allocator_type *)(long)in_ESI;
  __n = &local_16;
  local_14 = in_XMM1_Da;
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  std::allocator<float>::allocator((allocator<float> *)0x102354);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)__n,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x102374);
  local_14 = local_14 - local_10;
  fVar3 = (float)local_c;
  for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
    fVar2 = (float)iVar4 * (local_14 / fVar3) + local_10;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)iVar4);
    *pvVar1 = fVar2;
  }
  return in_RDI;
}

Assistant:

std::vector<float> f32_range(int n, float start, float end) {
    std::vector<float> values(n);
    float step = (end - start) / n;
    for (int i = 0; i < n; i++) {
        values[i] = start + i * step;
    }
    return values;
}